

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSwap
          (CodeGeneratorRequest *this,CodeGeneratorRequest *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  void *pvVar3;
  Version *pVVar4;
  long __tmp;
  
  iVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ =
       (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar2;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
             &(other->file_to_generate_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->proto_file_).super_RepeatedPtrFieldBase,
             &(other->proto_file_).super_RepeatedPtrFieldBase);
  pvVar3 = (other->parameter_).tagged_ptr_.ptr_;
  (other->parameter_).tagged_ptr_.ptr_ = (this->parameter_).tagged_ptr_.ptr_;
  (this->parameter_).tagged_ptr_.ptr_ = pvVar3;
  pVVar4 = this->compiler_version_;
  this->compiler_version_ = other->compiler_version_;
  other->compiler_version_ = pVVar4;
  return;
}

Assistant:

void CodeGeneratorRequest::InternalSwap(CodeGeneratorRequest* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  file_to_generate_.InternalSwap(&other->file_to_generate_);
  proto_file_.InternalSwap(&other->proto_file_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &parameter_, lhs_arena,
      &other->parameter_, rhs_arena
  );
  swap(compiler_version_, other->compiler_version_);
}